

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  CLzRef CVar3;
  UInt32 _cyclicBufferSize;
  byte *cur;
  CLzRef *pCVar4;
  bool bVar5;
  uint uVar6;
  UInt32 UVar7;
  UInt32 *pUVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  UInt32 maxLen;
  UInt32 UVar15;
  long lVar16;
  
  lenLimit = p->lenLimit;
  uVar12 = (ulong)lenLimit;
  if (uVar12 < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar14 = (uint)cur[1] ^ p->crc[*cur];
  uVar6 = (uint)cur[2] << 8 ^ uVar14;
  uVar14 = uVar14 & 0x3ff;
  uVar13 = (ulong)(uVar6 & 0xffff);
  pCVar4 = p->hash;
  CVar1 = p->pos;
  CVar2 = pCVar4[uVar14];
  uVar9 = CVar1 - CVar2;
  CVar3 = pCVar4[uVar13 + 0x400];
  uVar6 = ((p->crc[cur[3]] << 5 ^ uVar6) & p->hashMask) + 0x10400;
  UVar7 = pCVar4[uVar6];
  pCVar4[uVar14] = CVar1;
  pCVar4[uVar13 + 0x400] = CVar1;
  pCVar4[uVar6] = CVar1;
  lVar16 = 0;
  bVar5 = true;
  if ((uVar9 < p->cyclicBufferSize) && (cur[-(ulong)uVar9] == *cur)) {
    *distances = 2;
    distances[1] = uVar9 - 1;
    lVar16 = 2;
    bVar5 = false;
  }
  UVar15 = (UInt32)lVar16;
  if (((CVar3 == CVar2) || (uVar6 = CVar1 - CVar3, p->cyclicBufferSize <= uVar6)) ||
     (uVar13 = (ulong)uVar6, cur[-uVar13] != *cur)) {
    if (!bVar5) {
      uVar13 = (ulong)uVar9;
      goto LAB_00115316;
    }
    _cyclicBufferSize = p->cyclicBufferSize;
    UVar15 = 0;
    uVar6 = 0;
  }
  else {
    distances[lVar16 + 1] = uVar6 - 1;
    UVar15 = UVar15 + 2;
    lVar16 = 3;
LAB_00115316:
    pbVar10 = cur + lVar16;
    lVar16 = uVar12 - lVar16;
    do {
      pbVar11 = pbVar10;
      if (pbVar10[-uVar13] != *pbVar10) break;
      pbVar10 = pbVar10 + 1;
      lVar16 = lVar16 + -1;
      pbVar11 = cur + uVar12;
    } while (lVar16 != 0);
    uVar6 = (int)pbVar11 - (int)cur;
    distances[UVar15 - 2] = uVar6;
    _cyclicBufferSize = p->cyclicBufferSize;
    if (lenLimit == uVar6) {
      SkipMatchesSpec(lenLimit,UVar7,p->pos,cur,p->son,p->cyclicBufferPos,_cyclicBufferSize,
                      p->cutValue);
      goto LAB_001153a3;
    }
  }
  maxLen = 3;
  if (3 < uVar6) {
    maxLen = uVar6;
  }
  pUVar8 = GetMatchesSpec1(lenLimit,UVar7,p->pos,cur,p->son,p->cyclicBufferPos,_cyclicBufferSize,
                           p->cutValue,distances + UVar15,maxLen);
  UVar15 = (UInt32)((ulong)((long)pUVar8 - (long)distances) >> 2);
LAB_001153a3:
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar7 = p->pos + 1;
  p->pos = UVar7;
  if (UVar7 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar15;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];

  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;
  
  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;
  
  GET_MATCHES_FOOTER(offset, maxLen)
}